

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

HullError __thiscall HullLibrary::ReleaseResult(HullLibrary *this,HullResult *result)

{
  int iVar1;
  btAlignedObjectArray<btVector3> *in_RSI;
  
  iVar1 = btAlignedObjectArray<btVector3>::size
                    ((btAlignedObjectArray<btVector3> *)&in_RSI->m_capacity);
  if (iVar1 != 0) {
    in_RSI->m_size = 0;
    btAlignedObjectArray<btVector3>::clear(in_RSI);
  }
  iVar1 = btAlignedObjectArray<unsigned_int>::size
                    ((btAlignedObjectArray<unsigned_int> *)&in_RSI[1].m_data);
  if (iVar1 != 0) {
    *(undefined4 *)&in_RSI[1].field_0xc = 0;
    btAlignedObjectArray<unsigned_int>::clear((btAlignedObjectArray<unsigned_int> *)in_RSI);
  }
  return QE_OK;
}

Assistant:

HullError HullLibrary::ReleaseResult(HullResult &result) // release memory allocated for this result, we are done with it.
{
	if ( result.m_OutputVertices.size())
	{
		result.mNumOutputVertices=0;
		result.m_OutputVertices.clear();
	}
	if ( result.m_Indices.size() )
	{
		result.mNumIndices=0;
		result.m_Indices.clear();
	}
	return QE_OK;
}